

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall
chrono::ChFrameMoving<double>::ArchiveIN(ChFrameMoving<double> *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChCoordsys<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChCoordsys<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFrameMoving<double>>(marchive);
  ChFrame<double>::ArchiveIN(&this->super_ChFrame<double>,marchive);
  local_38 = &this->coord_dt;
  local_40 = &PTR__ChFunctorArchiveIn_0011f9e8;
  local_58 = "coord_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->coord_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_0011f9e8;
  local_58 = "coord_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive) override {
        // version number
        /*int version =*/marchive.VersionRead<ChFrameMoving>();

        // deserialize parent class
        ChFrame<Real>::ArchiveIN(marchive);

        // stream in all member data
        marchive >> CHNVP(coord_dt);
        marchive >> CHNVP(coord_dtdt);
    }